

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Automatic.cpp
# Opt level: O2

void __thiscall Automatic::fillAll(Automatic *this,int from,int to)

{
  size_type sVar1;
  mapped_type *pmVar2;
  int j;
  int iVar3;
  key_type local_2a;
  key_type local_29;
  
  for (iVar3 = 0; iVar3 != 0x100; iVar3 = iVar3 + 1) {
    local_29 = (key_type)iVar3;
    sVar1 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
            count(this->ac + from,&local_29);
    if (sVar1 == 0) {
      local_2a = (key_type)iVar3;
      pmVar2 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
               operator[](this->ac + from,&local_2a);
      *pmVar2 = to;
    }
  }
  return;
}

Assistant:

void Automatic::fillAll(int from, int to) {
    for(int j = 0; j < 256; ++j) {
        //避免出现覆盖问题
        if (ac[from].count(char(j)) != 0) continue;
        ac[from][char(j)] = to;
    }
}